

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.hpp
# Opt level: O1

iterator * __thiscall
ft::multiset<int,_ft::less<int>,_ft::allocator<int>_>::insert
          (iterator *__return_storage_ptr__,multiset<int,_ft::less<int>,_ft::allocator<int>_> *this,
          iterator *position,value_type *val)

{
  size_type *psVar1;
  int iVar2;
  treeNode<int> *ptVar3;
  treeNode<int> *curr;
  node *z;
  treeNode<int> *ptVar4;
  treeNode<int> *ptVar5;
  treeNode<int> *ptVar6;
  treeNode<int> *ptVar7;
  bool bVar8;
  
  if ((this->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
      super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_size != 0) {
    ptVar5 = (this->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
             super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_tree.m_last;
    curr = position->m_node;
    if (curr == ptVar5) {
      ptVar5 = curr->left;
      ptVar3 = position->m_tree->NIL;
      ptVar4 = curr;
      if (ptVar5 == ptVar3) {
        do {
          curr = ptVar4->parent;
          bVar8 = curr->left == ptVar4;
          ptVar4 = curr;
        } while (bVar8);
      }
      else {
        position->m_node = ptVar5;
        do {
          curr = ptVar5;
          ptVar5 = curr->right;
        } while (curr->right != ptVar3);
      }
      position->m_node = curr;
      if (curr->value < *val) goto LAB_00106ac7;
    }
    else {
      iVar2 = *val;
      ptVar3 = position->m_tree->NIL;
      if (curr->value < iVar2) {
        ptVar4 = curr;
        ptVar6 = curr->right;
        if (curr->right == ptVar3) {
          do {
            ptVar7 = ptVar4->parent;
            bVar8 = ptVar7->right == ptVar4;
            ptVar4 = ptVar7;
          } while (bVar8);
        }
        else {
          do {
            ptVar7 = ptVar6;
            ptVar6 = ptVar7->left;
          } while (ptVar7->left != ptVar3);
        }
        if ((ptVar7 == ptVar5) || (iVar2 < ptVar7->value)) goto LAB_00106ac7;
      }
      else {
        ptVar5 = curr;
        ptVar4 = curr->left;
        if (curr->left == ptVar3) {
          do {
            ptVar6 = ptVar5->parent;
            bVar8 = ptVar6->left == ptVar5;
            ptVar5 = ptVar6;
          } while (bVar8);
        }
        else {
          do {
            ptVar6 = ptVar4;
            ptVar4 = ptVar6->right;
          } while (ptVar6->right != ptVar3);
        }
        if ((curr == ((this->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
                      super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_tree.
                     m_first)->parent) || (ptVar6->value < iVar2)) goto LAB_00106ac7;
      }
    }
  }
  curr = (this->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
         super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_tree.m_root;
LAB_00106ac7:
  z = BSTinsert(this,curr,val);
  treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>::fixInsertViolation
            ((treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_> *)this,z);
  psVar1 = &(this->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
            super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_size;
  *psVar1 = *psVar1 + 1;
  __return_storage_ptr__->_vptr_treeIterator = (_func_int **)&PTR__treeIterator_0010dd18;
  __return_storage_ptr__->m_tree =
       &(this->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
        super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_tree;
  __return_storage_ptr__->m_node = z;
  return __return_storage_ptr__;
}

Assistant:

iterator	insert(iterator position, value_type const & val) {
		node*	ret;

		if (this->empty())
			ret = this->BSTinsert(this->root(), val);
		else if (position == this->end()) {
			--position;
			if (this->key_comp()(*position, val))
				ret = this->BSTinsert(position.node(), val);
			else
				ret = this->BSTinsert(this->root(), val);
		}
		else if (this->key_comp()(*position, val)) {
			iterator	tmp(position);
			++tmp;
			if (tmp == this->end() || this->key_comp()(val, *tmp))
				ret = this->BSTinsert(position.node(), val);
			else
				ret = this->BSTinsert(this->root(), val);
		}
		else {
			iterator	tmp(position);
			--tmp;
			if (position == this->begin() || this->key_comp()(*tmp, val))
				ret = this->BSTinsert(position.node(), val);
			else
				ret = this->BSTinsert(this->root(), val);
		}
		this->fixInsertViolation(ret);
		++this->m_size;
		return iterator(this->m_tree, ret);
	}